

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix * __thiscall maths::Matrix::operator=(Matrix *this,Matrix *m)

{
  double **ppdVar1;
  double **ppdVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int j;
  ulong uVar9;
  int i;
  long lVar10;
  
  if (this != m) {
    uVar4 = this->rows_;
    if ((uVar4 != m->rows_) || (uVar6 = this->cols_, uVar6 != m->cols_)) {
      for (lVar10 = 0; ppdVar1 = this->p, lVar10 < (int)uVar4; lVar10 = lVar10 + 1) {
        if (ppdVar1[lVar10] != (double *)0x0) {
          operator_delete__(ppdVar1[lVar10]);
          uVar4 = this->rows_;
        }
      }
      if (ppdVar1 != (double **)0x0) {
        operator_delete__(ppdVar1);
      }
      iVar3 = m->cols_;
      this->rows_ = m->rows_;
      this->cols_ = iVar3;
      allocSpace(this);
      uVar4 = this->rows_;
      uVar6 = this->cols_;
    }
    uVar8 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar8;
    }
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      ppdVar1 = m->p;
      ppdVar2 = this->p;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        ppdVar2[uVar8][uVar9] = ppdVar1[uVar8][uVar9];
      }
    }
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& m)
{

    if (this == &m) {
        return *this;
    }

    if (rows_ != m.rows_ || cols_ != m.cols_) {
        for (int i = 0; i < rows_; ++i) {
            delete[] p[i];
        }
        delete[] p;

        rows_ = m.rows_;
        cols_ = m.cols_;
        allocSpace();
    }

    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = m.p[i][j];
        }
    }
    return *this;
}